

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

SequenceConcatExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SequenceConcatExpr,nonstd::span_lite::span<slang::ast::SequenceConcatExpr::Element,18446744073709551615ul>>
          (BumpAllocator *this,
          span<slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> *args)

{
  pointer pEVar1;
  size_type sVar2;
  SequenceConcatExpr *pSVar3;
  
  pSVar3 = (SequenceConcatExpr *)allocate(this,0x20,8);
  pEVar1 = args->data_;
  sVar2 = args->size_;
  (pSVar3->super_AssertionExpr).kind = SequenceConcat;
  (pSVar3->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  (pSVar3->elements).data_ = pEVar1;
  (pSVar3->elements).size_ = sVar2;
  return pSVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }